

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_hash nk_murmur_hash(void *key,int len,nk_hash seed)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  nk_uint h1;
  long lVar4;
  nk_byte *keyptr;
  ulong uVar5;
  uint uVar6;
  
  iVar2 = (int)((long)len / 4);
  if (key == (void *)0x0) {
    return 0;
  }
  lVar4 = 0;
  uVar5 = 0;
  if (0 < iVar2) {
    uVar5 = (long)len / 4 & 0xffffffff;
  }
  for (; (int)uVar5 != (int)lVar4; lVar4 = lVar4 + 1) {
    iVar1 = *(int *)((long)key + lVar4 * 4);
    uVar6 = ((uint)(iVar1 * -0x3361d2af) >> 0x11 | iVar1 * 0x16a88000) * 0x1b873593 ^ seed;
    seed = (uVar6 << 0xd | uVar6 >> 0x13) * 5 + 0xe6546b64;
  }
  lVar4 = (long)iVar2;
  uVar3 = 0;
  uVar6 = 0;
  switch(len & 3) {
  case 3:
    uVar6 = (uint)*(byte *)((long)key + lVar4 * 4 + 2) << 0x10;
  case 2:
    uVar3 = uVar6 | (uint)*(byte *)((long)key + lVar4 * 4 + 1) << 8;
  case 1:
    uVar3 = *(byte *)((long)key + lVar4 * 4) | uVar3;
    seed = seed ^ (uVar3 * -0x3361d2af >> 0x11 | uVar3 * 0x16a88000) * 0x1b873593;
  case 0:
    uVar6 = ((seed ^ len) >> 0x10 ^ seed ^ len) * -0x7a143595;
    uVar6 = (uVar6 >> 0xd ^ uVar6) * -0x3d4d51cb;
    return uVar6 >> 0x10 ^ uVar6;
  }
}

Assistant:

NK_API nk_hash
nk_murmur_hash(const void * key, int len, nk_hash seed)
{
/* 32-Bit MurmurHash3: https://code.google.com/p/smhasher/wiki/MurmurHash3*/
#define NK_ROTL(x,r) ((x) << (r) | ((x) >> (32 - r)))

nk_uint h1 = seed;
nk_uint k1;
const nk_byte *data = (const nk_byte*)key;
const nk_byte *keyptr = data;
nk_byte *k1ptr;
const int bsize = sizeof(k1);
const int nblocks = len/4;

const nk_uint c1 = 0xcc9e2d51;
const nk_uint c2 = 0x1b873593;
const nk_byte *tail;
int i;

/* body */
if (!key) return 0;
for (i = 0; i < nblocks; ++i, keyptr += bsize) {
k1ptr = (nk_byte*)&k1;
k1ptr[0] = keyptr[0];
k1ptr[1] = keyptr[1];
k1ptr[2] = keyptr[2];
k1ptr[3] = keyptr[3];

k1 *= c1;
k1 = NK_ROTL(k1,15);
k1 *= c2;

h1 ^= k1;
h1 = NK_ROTL(h1,13);
h1 = h1*5+0xe6546b64;
}

/* tail */
tail = (const nk_byte*)(data + nblocks*4);
k1 = 0;
switch (len & 3) {
case 3: k1 ^= (nk_uint)(tail[2] << 16); /* fallthrough */
case 2: k1 ^= (nk_uint)(tail[1] << 8u); /* fallthrough */
case 1: k1 ^= tail[0];
k1 *= c1;
k1 = NK_ROTL(k1,15);
k1 *= c2;
h1 ^= k1;
break;
default: break;
}

/* finalization */
h1 ^= (nk_uint)len;
/* fmix32 */
h1 ^= h1 >> 16;
h1 *= 0x85ebca6b;
h1 ^= h1 >> 13;
h1 *= 0xc2b2ae35;
h1 ^= h1 >> 16;

#undef NK_ROTL
return h1;
}